

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *lhs,vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *rhs)

{
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *__first1;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *__last1;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *__first2;
  bool bVar1;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  __first1 = (lhs->
             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __last1 = (lhs->
            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (rhs->
             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((long)__last1 - (long)__first1 ==
      (long)(rhs->
            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
    bVar1 = std::__equal<false>::
            equal<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>const*,std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>const*>
                      (__first1,__last1,__first2);
    if (bVar1) {
      AVar3 = AssertionSuccess();
      sVar2 = AVar3.message_.ptr_;
      goto LAB_00120fc7;
    }
  }
  AVar3 = CmpHelperEQFailure<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                    (this,lhs_expression,rhs_expression,lhs,rhs);
  sVar2 = AVar3.message_.ptr_;
LAB_00120fc7:
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}